

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O1

int main(void)

{
  istream *piVar1;
  ostream *poVar2;
  Vector2d q;
  lmik solver;
  Vector2d X;
  Matrix<double,_2,_1,_0,_2,_1> local_88;
  lmik local_78;
  Vector2d local_28;
  Scalar local_18;
  
  local_78.W_N_bar.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
  array[0] = (double)&local_88;
  local_78.W_N_bar.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
  array[1] = 0.0;
  local_78.W_N_bar.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
  array[2] = 4.94065645841247e-324;
  local_78.W_N_bar.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
  array[3] = 4.94065645841247e-324;
  local_88.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] =
       1.5707963267948966;
  local_18 = 0.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::operator_
            ((CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)&local_78,&local_18);
  if (((long)local_78.W_N_bar.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage
             .m_data.array[3] +
       (long)local_78.W_N_bar.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage
             .m_data.array[1] == 2) &&
     (local_78.W_N_bar.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data
      .array[2] == 4.94065645841247e-324)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Enter the target position (x, y)",0x20);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
    std::ostream::put('H');
    std::ostream::flush();
    piVar1 = std::istream::_M_extract<double>((double *)&std::cin);
    std::istream::_M_extract<double>((double *)piVar1);
    lmik::lmik(&local_78);
    lmik::solve(&local_78,&local_88,&local_28);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"q(0): ",6);
    poVar2 = std::ostream::_M_insert<double>
                       (local_88.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.
                        m_storage.m_data.array[0]);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"q(1): ",6);
    poVar2 = std::ostream::_M_insert<double>
                       (local_88.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.
                        m_storage.m_data.array[1]);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    lmik::~lmik(&local_78);
    return 0;
  }
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 2, 1>>::finished() [MatrixType = Eigen::Matrix<double, 2, 1>]"
               );
}

Assistant:

int main() {    
    Vector2d q, X, ans;
    q << M_PI_2, 0;
    
    cout << "Enter the target position (x, y)" << endl;
    cin >> X(0) >> X(1);

    lmik solver;
    solver.solve(q, X);
    cout << "q(0): " << q(0) << endl;
    cout << "q(1): " << q(1) << endl;
    
    return 0;
}